

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QGles2CommandBuffer::~QGles2CommandBuffer(QGles2CommandBuffer *this)

{
  QGles2CommandBuffer *in_RDI;
  
  ~QGles2CommandBuffer(in_RDI);
  operator_delete(in_RDI,0x580);
  return;
}

Assistant:

QGles2CommandBuffer::~QGles2CommandBuffer()
{
    destroy();
}